

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normal_dist.hpp
# Opt level: O2

result_type_conflict2 __thiscall
trng::normal_dist<double>::cdf(normal_dist<double> *this,result_type_conflict2 x)

{
  double dVar1;
  
  dVar1 = math::Phi((x - (this->P).mu_) / (this->P).sigma_);
  return dVar1;
}

Assistant:

cdf(result_type x) const {
      x -= P.mu();
      x /= P.sigma();
      return math::Phi(x);
    }